

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O2

void receiveTableCMD(packet_t *recv)

{
  __type _Var1;
  Link *__lhs;
  ostream *poVar2;
  string neighbor;
  packet_t local_1e8;
  routingtable_t neighborRoutingTable;
  stringstream sstrm;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&sstrm,(string *)recv,_S_out|_S_in);
  std::istream::ignore((long)&sstrm,-1);
  neighbor._M_dataplus._M_p = (pointer)&neighbor.field_2;
  neighbor._M_string_length = 0;
  neighbor.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&sstrm,(string *)&neighbor);
  __lhs = getLink(&neighbor);
  _Var1 = std::operator==(&__lhs->neighbor,
                          &(links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                            super__Vector_impl_data._M_finish)->neighbor);
  if (_Var1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "!!! Packet received from Unknown Router: DISCARDED");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    if (__lhs->status == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"----- link UP with : ");
      poVar2 = std::operator<<(poVar2,(string *)__lhs);
      poVar2 = std::operator<<(poVar2," -----");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    __lhs->status = 1;
    __lhs->recvClock = currentClock;
    std::__cxx11::string::find((char)recv,10);
    std::__cxx11::string::substr((ulong)&local_1e8,(ulong)recv);
    extractTable(&neighborRoutingTable,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    updateRoutingTableForNeighbor(&neighbor,&neighborRoutingTable);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
    ::~_Rb_tree(&neighborRoutingTable._M_t);
  }
  std::__cxx11::string::~string((string *)&neighbor);
  std::__cxx11::stringstream::~stringstream((stringstream *)&sstrm);
  return;
}

Assistant:

void receiveTableCMD(const packet_t &recv) {
	stringstream sstrm(recv);
	sstrm.ignore(std::numeric_limits<streamsize>::max(), ' ');
	string neighbor;
	sstrm >> neighbor;
	Link &link = getLink(neighbor);
	if (link == *links.end()) {
		cout << "!!! Packet received from Unknown Router: DISCARDED" << endl;
		return;
	}
	if (link.status == DOWN) {
		cout << "----- link UP with : " << link.neighbor << " -----" << endl;
	}
	link.status = UP;
	link.recvClock = currentClock;
//	cout << "--------------------------------------" << endl;
//	cout << RECV_ROUTING_TABLE << "> from: " << neighbor << endl;
//	print_container(cout,extractTableFromPacket(recv.substr(16)),"\n");
//	printRoutingMap(extractTable(recv.substr(recv.find('\n') + 1)));
//	cout << "--------------------------------------" << endl;
	routingtable_t neighborRoutingTable = extractTable(recv.substr(recv.find('\n') + 1));
	updateRoutingTableForNeighbor(neighbor, neighborRoutingTable);
}